

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_bcast.c
# Opt level: O1

int non_empty_broadcast_test
              (kvtree *kvtree_1,kvtree *kvtree_2,int rank,char *one,int val_of_one,char *two,
              int val_of_two,char *three,int val_of_three)

{
  int iVar1;
  char *pcVar2;
  uint local_34;
  
  if (rank != 1) {
    kvtree_2 = kvtree_1;
  }
  local_34 = val_of_one;
  iVar1 = kvtree_bcast(kvtree_2,0,&ompi_mpi_comm_world);
  if (iVar1 == 0) {
    if (kvtree_2 == (kvtree *)0x0) {
      printf("Error in line %d, file %s, function %s.\n",0x17,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
             ,"non_empty_broadcast_test");
      pcVar2 = "rank =%d, kvtree_bcast operation resulted in NULL kvtree\n";
    }
    else {
      iVar1 = kvtree_util_get_int(kvtree_2,one,&local_34);
      if (iVar1 == 0) {
        iVar1 = kvtree_util_get_int(kvtree_2,two,&val_of_two);
        pcVar2 = three;
        if (iVar1 == 0) {
          if ((local_34 == 1) && (val_of_two == 2)) {
            iVar1 = kvtree_util_get_int(kvtree_2,three,&val_of_three);
            if (iVar1 != 0) {
              printf("Rank = %d; ONE = %d; TWO = %d\n",(ulong)(uint)rank,(ulong)local_34,
                     (ulong)(uint)val_of_two);
              if (rank != 1) {
                return 0;
              }
              iVar1 = kvtree_util_get_int(kvtree_1,one,&local_34);
              if (iVar1 == 0) {
                if (local_34 == 0xffffffff) {
                  iVar1 = kvtree_util_get_int(kvtree_1,two,&val_of_two);
                  if (iVar1 == 0) {
                    if (val_of_two == -2) {
                      iVar1 = kvtree_util_get_int(kvtree_1,pcVar2,&val_of_three);
                      if (iVar1 == 0) {
                        if (val_of_three == -3) {
                          return 0;
                        }
                        printf("Error in line %d, file %s, function %s.\n",0x52,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                               ,"non_empty_broadcast_test");
                        pcVar2 = "rank = 1, kvtree_1 read of \'THREE\' returned wrong value";
                      }
                      else {
                        printf("Error in line %d, file %s, function %s.\n",0x4d,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                               ,"non_empty_broadcast_test");
                        pcVar2 = "rank = 1, kvtree_1 read of \'THREE\' failed";
                      }
                    }
                    else {
                      printf("Error in line %d, file %s, function %s.\n",0x47,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                             ,"non_empty_broadcast_test");
                      pcVar2 = "rank = 1, kvtree_1 read of \'TWO\' returned wrong value";
                    }
                  }
                  else {
                    printf("Error in line %d, file %s, function %s.\n",0x42,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                           ,"non_empty_broadcast_test");
                    pcVar2 = "rank = 1, kvtree_1 read of \'TWO\' failed";
                  }
                }
                else {
                  printf("Error in line %d, file %s, function %s.\n",0x3c,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                         ,"non_empty_broadcast_test");
                  pcVar2 = "rank = 1, kvtree_1 read of \'ONE\' returned wrong value";
                }
              }
              else {
                printf("Error in line %d, file %s, function %s.\n",0x37,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                       ,"non_empty_broadcast_test");
                pcVar2 = "rank = 1, kvtree_1 read of \'ONE\' failed";
              }
              puts(pcVar2);
              return 1;
            }
            printf("Error in line %d, file %s, function %s.\n",0x2e,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                   ,"non_empty_broadcast_test");
            pcVar2 = "rank =%d, kvtree_sent_received  read of nonexisting key \'THREE\' succeeded\n"
            ;
          }
          else {
            printf("Error in line %d, file %s, function %s.\n",0x28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                   ,"non_empty_broadcast_test");
            pcVar2 = 
            "rank =%d, kvtree_sent_received  read of \'ONE\' OR \'TWO\' returned wrong value\n";
          }
        }
        else {
          printf("Error in line %d, file %s, function %s.\n",0x23,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
                 ,"non_empty_broadcast_test");
          pcVar2 = "rank =%d, kvtree_sent_received  read of \'TWO\' failed\n";
        }
      }
      else {
        printf("Error in line %d, file %s, function %s.\n",0x1d,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
               ,"non_empty_broadcast_test");
        pcVar2 = "rank =%d, kvtree_sent_received  read of \'ONE\' failed\n";
      }
    }
    printf(pcVar2,(ulong)(uint)rank);
  }
  else {
    printf("Error in line %d, file %s, function %s.\n",0x12,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
           ,"non_empty_broadcast_test");
    printf("kvtree_bcast non-empty operation failed");
  }
  return 1;
}

Assistant:

int non_empty_broadcast_test(kvtree* kvtree_1, kvtree* kvtree_2, int rank, const char*one, int val_of_one, const char* two, int val_of_two, const char* three, int val_of_three){
//  int rc = TEST_PASS;
  int kvtree_rc;
  //points to the hash that's passed to the kvtree_bcast function.
  //we want the receiving hash for rank 1 to be kvtree_1. For other processes,
  //sending/receiving hash should be kvtree
  kvtree *kvtree_sent_received;
  kvtree_sent_received = ( rank == 1? kvtree_2 : kvtree_1 );
  kvtree_rc = kvtree_bcast( kvtree_sent_received , 0, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("kvtree_bcast non-empty operation failed");
    return TEST_FAIL;
  }
  if ( kvtree_sent_received == NULL){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("rank =%d, kvtree_bcast operation resulted in NULL kvtree\n", rank);
    return TEST_FAIL;
  }
  kvtree_rc = kvtree_util_get_int(kvtree_sent_received , one, &val_of_one);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("rank =%d, kvtree_sent_received  read of 'ONE' failed\n", rank);
    return TEST_FAIL;
  }
  kvtree_rc = kvtree_util_get_int(kvtree_sent_received , two, &val_of_two);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("rank =%d, kvtree_sent_received  read of 'TWO' failed\n", rank);
    return TEST_FAIL;
  }
  if((val_of_one != 1) || (val_of_two != 2)){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("rank =%d, kvtree_sent_received  read of 'ONE' OR 'TWO' returned wrong value\n", rank);
    return TEST_FAIL;
  }
  kvtree_rc = kvtree_util_get_int(kvtree_sent_received , three, &val_of_three);
  if (kvtree_rc == KVTREE_SUCCESS){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("rank =%d, kvtree_sent_received  read of nonexisting key 'THREE' succeeded\n", rank);
    return TEST_FAIL;
  }
printf("Rank = %d; ONE = %d; TWO = %d\n", rank, val_of_one, val_of_two);
  //check that for process 1 kvtree_1 hash is unaffected by bcast
  if(rank == 1){
    kvtree_rc = kvtree_util_get_int(kvtree_1, one, &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      printf("rank = 1, kvtree_1 read of 'ONE' failed\n");
      return TEST_FAIL;
    }
    else if((val_of_one != -1)){
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      printf("rank = 1, kvtree_1 read of 'ONE' returned wrong value\n");
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(kvtree_1, two, &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      printf("rank = 1, kvtree_1 read of 'TWO' failed\n");
      return TEST_FAIL;
    }
    else if((val_of_two != -2)){
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      printf("rank = 1, kvtree_1 read of 'TWO' returned wrong value\n");
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(kvtree_1, three, &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      printf("rank = 1, kvtree_1 read of 'THREE' failed\n");
      return TEST_FAIL;
    }
    else if((val_of_three != -3)){
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      printf("rank = 1, kvtree_1 read of 'THREE' returned wrong value\n");
      return TEST_FAIL;
    }
  }
  return TEST_PASS;
}